

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O3

string * __thiscall
dtc::anon_unknown_3::dirbasename
          (string *__return_storage_ptr__,anon_unknown_3 *this,function<char_*(char_*)> *fn,
          string *s)

{
  char *__ptr;
  char *__s;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar1;
  undefined8 uVar2;
  allocator<char> local_21;
  char *local_20;
  
  if (s == (string *)0x0) {
    psVar1 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar1;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    __ptr = strdup((char *)fn);
    local_20 = __ptr;
    if (*(long *)(this + 0x10) == 0) {
      uVar2 = std::__throw_bad_function_call();
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      _Unwind_Resume(uVar2);
    }
    __s = (char *)(**(code **)(this + 0x18))(this,&local_20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_21);
    psVar1 = extraout_RAX;
    if (__ptr != (char *)0x0) {
      free(__ptr);
      psVar1 = extraout_RAX_00;
    }
  }
  return psVar1;
}

Assistant:

string
dirbasename(std::function<char*(char*)> fn, const string &s)
{
	if (s == string())
	{
		return string();
	}
	std::unique_ptr<char, decltype(free)*> str = {strdup(s.c_str()), free};
	string dn(fn(str.get()));
	return dn;
}